

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall kratos::SystemVerilogCodeGen::dispatch_node(SystemVerilogCodeGen *this,IRNode *node)

{
  IRNode *pIVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 auVar2 [12];
  string local_90;
  IRNode *local_70;
  string local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  allocator_type local_21;
  
  if (node->ast_node_type_ == StmtKind) {
    pIVar1 = node;
    if ((this->options_).yosys_src == true) {
      output_yosys_src(this,node);
    }
    switch(*(undefined4 *)
            &node[1].fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    case 0:
      stmt_code(this,(IfStmt *)node);
      return;
    case 1:
      stmt_code(this,(SwitchStmt *)node);
      return;
    case 2:
      stmt_code(this,(ForStmt *)node);
      return;
    case 3:
      (*this->_vptr_SystemVerilogCodeGen[1])(this,node);
      return;
    case 4:
      stmt_code(this,(StmtBlock *)node);
      return;
    case 5:
      stmt_code(this,(ModuleInstantiationStmt *)node);
      return;
    default:
      return;
    case 7:
      stmt_code(this,(FunctionCallStmt *)node);
      return;
    case 8:
      stmt_code(this,(ReturnStmt *)node);
      return;
    case 9:
      stmt_code(this,(BreakStmt *)pIVar1);
      return;
    case 10:
      stmt_code(this,(AssertBase *)node);
      return;
    case 0xb:
      stmt_code(this,(CommentStmt *)node);
      return;
    case 0xc:
      stmt_code(this,(RawStringStmt *)node);
      return;
    case 0xd:
      stmt_code(this,(AuxiliaryStmt *)node);
      return;
    }
  }
  auVar2 = __cxa_allocate_exception(0x10);
  ast_type_to_string_abi_cxx11_(&local_68,(kratos *)(ulong)node->ast_node_type_,auVar2._8_4_);
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
  local_48.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x2a;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_90,(detail *)"Cannot codegen non-statement node. Got {0}",format_str,args);
  __l._M_len = 1;
  __l._M_array = &local_70;
  local_70 = node;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_48,__l,&local_21);
  StmtException::StmtException(auVar2._0_8_,&local_90,&local_48);
  __cxa_throw(auVar2._0_8_,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SystemVerilogCodeGen::dispatch_node(IRNode* node) {
    if (node->ir_node_kind() != IRNodeKind::StmtKind)
        throw StmtException(::format("Cannot codegen non-statement node. Got {0}",
                                     ast_type_to_string(node->ir_node_kind())),
                            {node});
    auto* stmt_ptr = reinterpret_cast<Stmt*>(node);

    // yosys src
    if (options_.yosys_src) output_yosys_src(node);

    // use switch for branch tables
    // also let compiler check if we have all the types covered
    switch (stmt_ptr->type()) {
        case StatementType::Assign:
            stmt_code(reinterpret_cast<AssignStmt*>(node));
            break;
        case StatementType::Block:
            stmt_code(reinterpret_cast<StmtBlock*>(node));
            break;
        case StatementType::If:
            stmt_code(reinterpret_cast<IfStmt*>(node));
            break;
        case StatementType::ModuleInstantiation:
            stmt_code(reinterpret_cast<ModuleInstantiationStmt*>(node));
            break;
        case StatementType::Switch:
            stmt_code(reinterpret_cast<SwitchStmt*>(node));
            break;
        case StatementType::FunctionalCall:
            stmt_code(reinterpret_cast<FunctionCallStmt*>(node));
            break;
        case StatementType::Return:
            stmt_code(reinterpret_cast<ReturnStmt*>(node));
            break;
        case StatementType::Assert:
            stmt_code(reinterpret_cast<AssertBase*>(node));
            break;
        case StatementType::Comment:
            stmt_code(reinterpret_cast<CommentStmt*>(node));
            break;
        case StatementType::InterfaceInstantiation:
            // do nothing
            break;
        case StatementType::RawString:
            stmt_code(reinterpret_cast<RawStringStmt*>(node));
            break;
        case StatementType::For:
            stmt_code(reinterpret_cast<ForStmt*>(node));
            break;
        case StatementType::Auxiliary:
            stmt_code(reinterpret_cast<AuxiliaryStmt*>(node));
            break;
        case StatementType::Break:
            stmt_code(reinterpret_cast<BreakStmt*>(node));
            break;
    }
}